

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void nghttp2_session_keep_closed_stream(nghttp2_session *session,nghttp2_stream *stream)

{
  nghttp2_stream *stream_local;
  nghttp2_session *session_local;
  
  if (session->closed_stream_tail == (nghttp2_stream *)0x0) {
    session->closed_stream_head = stream;
  }
  else {
    session->closed_stream_tail->closed_next = stream;
    stream->closed_prev = session->closed_stream_tail;
  }
  session->closed_stream_tail = stream;
  session->num_closed_streams = session->num_closed_streams + 1;
  return;
}

Assistant:

void nghttp2_session_keep_closed_stream(nghttp2_session *session,
                                        nghttp2_stream *stream) {
  DEBUGF("stream: keep closed stream(%p)=%d, state=%d\n", stream,
         stream->stream_id, stream->state);

  if (session->closed_stream_tail) {
    session->closed_stream_tail->closed_next = stream;
    stream->closed_prev = session->closed_stream_tail;
  } else {
    session->closed_stream_head = stream;
  }
  session->closed_stream_tail = stream;

  ++session->num_closed_streams;
}